

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

double matd_det(matd_t *a)

{
  matd_t mVar1;
  matd_t mVar2;
  matd_t mVar3;
  matd_t mVar4;
  matd_t mVar5;
  matd_t mVar6;
  matd_t mVar7;
  matd_t mVar8;
  matd_t mVar9;
  matd_t mVar10;
  matd_t mVar11;
  matd_t mVar12;
  matd_t mVar13;
  matd_t mVar14;
  matd_t mVar15;
  matd_t mVar16;
  double m33;
  double m32;
  double m31;
  double m30;
  double m23;
  double m22;
  double m21;
  double m20;
  double m13;
  double m12;
  double m11;
  double m10;
  double m03;
  double m02;
  double m01;
  double m00;
  matd_t *a_local;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x1a6,"double matd_det(const matd_t *)");
  }
  if (a->nrows != a->ncols) {
    __assert_fail("a->nrows == a->ncols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x1a7,"double matd_det(const matd_t *)");
  }
  switch(a->nrows) {
  case 0:
    if (a->nrows == 0) {
      __assert_fail("a->nrows > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                    ,0x1ac,"double matd_det(const matd_t *)");
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x1d9,"double matd_det(const matd_t *)");
  case 1:
    a_local = *(matd_t **)(a + 1);
    break;
  case 2:
    a_local = (matd_t *)((double)a[1] * (double)a[4] + -((double)a[2] * (double)a[3]));
    break;
  case 3:
    a_local = (matd_t *)
              (-((double)a[3] * (double)a[5]) * (double)a[7] +
              (double)a[3] * (double)a[4] * (double)a[8] +
              -((double)a[2] * (double)a[4]) * (double)a[9] +
              (double)a[2] * (double)a[6] * (double)a[7] +
              (double)a[1] * (double)a[5] * (double)a[9] +
              -((double)a[1] * (double)a[6] * (double)a[8]));
    break;
  case 4:
    mVar1 = a[1];
    mVar2 = a[2];
    mVar3 = a[3];
    mVar4 = a[4];
    mVar5 = a[(ulong)a->ncols + 1];
    mVar6 = a[(ulong)(a->ncols + 1) + 1];
    mVar7 = a[(ulong)(a->ncols + 2) + 1];
    mVar8 = a[(ulong)(a->ncols + 3) + 1];
    mVar9 = a[(ulong)(a->ncols << 1) + 1];
    mVar10 = a[(ulong)(a->ncols * 2 + 1) + 1];
    mVar11 = a[(ulong)(a->ncols * 2 + 2) + 1];
    mVar12 = a[(ulong)(a->ncols * 2 + 3) + 1];
    mVar13 = a[(ulong)(a->ncols * 3) + 1];
    mVar14 = a[(ulong)(a->ncols * 3 + 1) + 1];
    mVar15 = a[(ulong)(a->ncols * 3 + 2) + 1];
    mVar16 = a[(ulong)(a->ncols * 3 + 3) + 1];
    a_local = (matd_t *)
              ((double)mVar13 * (double)mVar10 * (double)mVar4 * (double)mVar7 +
              -((double)mVar13 * (double)mVar10 * (double)mVar3) * (double)mVar8 +
              -((double)mVar13 * (double)mVar6 * (double)mVar4) * (double)mVar11 +
              (double)mVar13 * (double)mVar6 * (double)mVar3 * (double)mVar12 +
              (double)mVar13 * (double)mVar2 * (double)mVar8 * (double)mVar11 +
              -((double)mVar13 * (double)mVar2 * (double)mVar7) * (double)mVar12 +
              -((double)mVar9 * (double)mVar14 * (double)mVar4) * (double)mVar7 +
              (double)mVar9 * (double)mVar14 * (double)mVar3 * (double)mVar8 +
              (double)mVar9 * (double)mVar6 * (double)mVar4 * (double)mVar15 +
              -((double)mVar9 * (double)mVar6 * (double)mVar3) * (double)mVar16 +
              -((double)mVar9 * (double)mVar2 * (double)mVar8) * (double)mVar15 +
              (double)mVar9 * (double)mVar2 * (double)mVar7 * (double)mVar16 +
              (double)mVar5 * (double)mVar14 * (double)mVar4 * (double)mVar11 +
              -((double)mVar5 * (double)mVar14 * (double)mVar3) * (double)mVar12 +
              -((double)mVar5 * (double)mVar10 * (double)mVar4) * (double)mVar15 +
              (double)mVar5 * (double)mVar10 * (double)mVar3 * (double)mVar16 +
              (double)mVar5 * (double)mVar2 * (double)mVar12 * (double)mVar15 +
              -((double)mVar5 * (double)mVar2 * (double)mVar11) * (double)mVar16 +
              -((double)mVar1 * (double)mVar14 * (double)mVar8) * (double)mVar11 +
              (double)mVar1 * (double)mVar14 * (double)mVar7 * (double)mVar12 +
              (double)mVar1 * (double)mVar10 * (double)mVar8 * (double)mVar15 +
              -((double)mVar1 * (double)mVar10 * (double)mVar7) * (double)mVar16 +
              (double)mVar1 * (double)mVar6 * (double)mVar11 * (double)mVar16 +
              -((double)mVar1 * (double)mVar6 * (double)mVar12 * (double)mVar15));
    break;
  default:
    a_local = (matd_t *)matd_det_general(a);
  }
  return (double)a_local;
}

Assistant:

double matd_det(const matd_t *a)
{
    assert(a != NULL);
    assert(a->nrows == a->ncols);

    switch(a->nrows) {
        case 0:
            // scalar: invalid
            assert(a->nrows > 0);
            break;

        case 1:
            // 1x1 matrix
            return a->data[0];

        case 2:
            // 2x2 matrix
            return a->data[0] * a->data[3] - a->data[1] * a->data[2];

        case 3:
            // 3x3 matrix
            return  a->data[0]*a->data[4]*a->data[8]
                - a->data[0]*a->data[5]*a->data[7]
                + a->data[1]*a->data[5]*a->data[6]
                - a->data[1]*a->data[3]*a->data[8]
                + a->data[2]*a->data[3]*a->data[7]
                - a->data[2]*a->data[4]*a->data[6];

        case 4: {
            // 4x4 matrix
            double m00 = MATD_EL(a,0,0), m01 = MATD_EL(a,0,1), m02 = MATD_EL(a,0,2), m03 = MATD_EL(a,0,3);
            double m10 = MATD_EL(a,1,0), m11 = MATD_EL(a,1,1), m12 = MATD_EL(a,1,2), m13 = MATD_EL(a,1,3);
            double m20 = MATD_EL(a,2,0), m21 = MATD_EL(a,2,1), m22 = MATD_EL(a,2,2), m23 = MATD_EL(a,2,3);
            double m30 = MATD_EL(a,3,0), m31 = MATD_EL(a,3,1), m32 = MATD_EL(a,3,2), m33 = MATD_EL(a,3,3);

            return m00 * m11 * m22 * m33 - m00 * m11 * m23 * m32 -
                m00 * m21 * m12 * m33 + m00 * m21 * m13 * m32 + m00 * m31 * m12 * m23 -
                m00 * m31 * m13 * m22 - m10 * m01 * m22 * m33 +
                m10 * m01 * m23 * m32 + m10 * m21 * m02 * m33 -
                m10 * m21 * m03 * m32 - m10 * m31 * m02 * m23 +
                m10 * m31 * m03 * m22 + m20 * m01 * m12 * m33 -
                m20 * m01 * m13 * m32 - m20 * m11 * m02 * m33 +
                m20 * m11 * m03 * m32 + m20 * m31 * m02 * m13 -
                m20 * m31 * m03 * m12 - m30 * m01 * m12 * m23 +
                m30 * m01 * m13 * m22 + m30 * m11 * m02 * m23 -
                m30 * m11 * m03 * m22 - m30 * m21 * m02 * m13 +
                m30 * m21 * m03 * m12;
        }

        default:
            return matd_det_general(a);
    }

    assert(0);
    return 0;
}